

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::ShapeFunctionsDerivatives
          (ChElementCableANCF *this,ShapeVector *Nd,double xi)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  dVar1 = (this->super_ChElementBeam).length;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = xi;
  auVar2 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar2,ZEXT816(0x3ff0000000000000));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = xi * xi;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = xi * -6.0;
  auVar7 = vfmadd231sd_fma(auVar7,auVar5,ZEXT816(0x4018000000000000));
  auVar2 = vfmadd231sd_fma(auVar2,auVar5,ZEXT816(0x4008000000000000));
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = xi;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = xi * xi * 3.0;
  auVar3 = vfmadd231sd_fma(auVar6,auVar3,ZEXT816(0xc000000000000000));
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar7,auVar4);
  (Nd->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[0] =
       auVar7._0_8_ / dVar1;
  (Nd->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[1] =
       auVar2._0_8_;
  (Nd->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[2] =
       auVar4._0_8_ / dVar1;
  (Nd->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[3] =
       auVar3._0_8_;
  return;
}

Assistant:

void ChElementCableANCF::ShapeFunctionsDerivatives(ShapeVector& Nd, double xi) {
    double l = this->GetRestLength();

    Nd(0) = (6.0 * pow(xi, 2.0) - 6.0 * xi) / l;
    Nd(1) = 1.0 - 4.0 * xi + 3.0 * pow(xi, 2.0);
    Nd(2) = -(6.0 * pow(xi, 2.0) - 6.0 * xi) / l;
    Nd(3) = -2.0 * xi + 3.0 * pow(xi, 2.0);
}